

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecPeformDec_rec
              (Sfm_Dec_t *p,word *pTruth,int *pSupp,int *pAssump,int nAssump,word (*Masks) [8],
              int fCofactor,int nSuppAdd)

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  word *pwVar4;
  word *pwVar5;
  Sfm_Par_t *pSVar6;
  int *piVar7;
  int iVar8;
  lit *end;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  word wVar14;
  uint *puVar15;
  long lVar16;
  word (*pawVar17) [8];
  timespec *ptVar18;
  uint uVar19;
  char *pcVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  bool bVar26;
  bool bVar27;
  uint local_22c;
  int nSupp [2];
  timespec ts;
  int Supp [2] [16];
  word uTruth [2] [4];
  
  if (8 < nAssump) {
    __assert_fail("nAssump <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x32f,
                  "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                 );
  }
  lVar11 = (long)p->pPars->nBTLimit;
  pwVar4 = p->pDivWords[nAssump];
  if (p->pPars->fVeryVerbose != 0) {
    printf("\nObject %d\n",(ulong)(uint)p->iTarget);
    printf("Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ",(double)p->AreaMffc * 0.001,
           (ulong)(uint)p->nDivs,(ulong)(uint)(p->vObjGates).nSize,(ulong)(uint)p->nMffc);
    printf("Pat0 = %d.  Pat1 = %d.    ",(ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
    putchar(10);
    if (nAssump != 0) {
      printf("Cofactor: ");
      if (0 < nAssump) {
        uVar23 = 0;
        do {
          uVar10 = pAssump[uVar23];
          if ((int)uVar10 < 0) {
LAB_004b167a:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10d,"int Abc_LitIsCompl(int)");
          }
          pcVar20 = "!";
          if ((uVar10 & 1) == 0) {
            pcVar20 = "";
          }
          printf(" %s%d",pcVar20,(ulong)(uVar10 >> 1));
          uVar23 = uVar23 + 1;
        } while ((uint)nAssump != uVar23);
      }
      putchar(10);
    }
  }
  piVar1 = pAssump + nAssump;
  end = pAssump + (long)nAssump + 1;
  uVar23 = 0;
  pawVar17 = Masks;
  do {
    if (0 < (long)p->nPatWords[uVar23]) {
      lVar12 = 0;
      do {
        if ((*pawVar17)[lVar12] != 0) goto LAB_004b0768;
        lVar12 = lVar12 + 1;
      } while (p->nPatWords[uVar23] != lVar12);
    }
    p->nSatCalls = p->nSatCalls + 1;
    if (p->iTarget < 0) goto LAB_004b165b;
    *piVar1 = (int)uVar23 + p->iTarget * 2;
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar12 = 1;
    }
    else {
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    iVar8 = sat_solver_solve(p->pSat,pAssump,end,lVar11,0,0,0);
    if (iVar8 != 1) {
      if (iVar8 == -1) {
        p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
        iVar8 = clock_gettime(3,(timespec *)&ts);
        if (iVar8 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeSatUnsat = p->timeSatUnsat + lVar11 + lVar12;
        pSVar6 = p->pPars;
        iVar8 = pSVar6->nVarMax;
        uVar22 = (ulong)(uint)(1 << ((char)iVar8 - 6U & 0x1f));
        if (iVar8 < 7) {
          uVar22 = 1;
        }
        if (0 < (int)uVar22) {
          uVar24 = 0;
          do {
            pTruth[uVar24] = (long)-(int)uVar23;
            uVar24 = uVar24 + 1;
          } while (uVar22 != uVar24);
        }
        if (pSVar6->fVeryVerbose != 0) {
          printf("Found constant %d.\n",uVar23 & 0xffffffff);
        }
        return 0;
      }
      if (iVar8 != 0) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x355,
                      "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                     );
      }
      goto LAB_004b09d1;
    }
    p->nSatCallsSat = p->nSatCallsSat + 1;
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeSatSat = p->timeSatSat + lVar16 + lVar12;
    if (p->nPats[uVar23] == 0x200) {
      p->nSatCallsOver = p->nSatCallsOver + 1;
    }
    else {
      if (0 < p->nDivs) {
        lVar12 = 0;
        lVar16 = 0;
        do {
          iVar8 = sat_solver_var_value(p->pSat,(int)lVar16);
          if (iVar8 != 0) {
            if (p->vSets[uVar23].nSize <= lVar12) goto LAB_004b163c;
            puVar2 = p->vSets[uVar23].pArray + (p->nPats[uVar23] >> 6) + lVar12;
            *puVar2 = *puVar2 | 1L << ((byte)p->nPats[uVar23] & 0x3f);
          }
          lVar16 = lVar16 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar16 < p->nDivs);
      }
      iVar8 = p->nPats[uVar23];
      p->nPatWords[uVar23] = (iVar8 >> 6) + 1;
      p->nPats[uVar23] = iVar8 + 1;
      Masks[uVar23][iVar8 >> 6] = Masks[uVar23][iVar8 >> 6] | 1L << ((byte)iVar8 & 0x3f);
    }
LAB_004b0768:
    pawVar17 = pawVar17 + 1;
    bVar26 = uVar23 == 0;
    uVar23 = uVar23 + 1;
  } while (bVar26);
  uVar10 = p->iUseThis;
  if (uVar10 == 0xffffffff) {
    p->vImpls[0].nSize = 0;
    p->vImpls[1].nSize = 0;
    if (0 < p->nDivs) {
      lVar12 = 0;
      uVar23 = 0;
      do {
        Supp[0][0] = -1;
        Supp[0][1] = -1;
        uVar10 = (uint)(uVar23 >> 4) & 0x3ffffff;
        pawVar17 = Masks;
        lVar16 = 0;
        do {
          if ((long)p->vSets[lVar16].nSize <= (long)(uVar23 * 8)) goto LAB_004b163c;
          pwVar5 = p->vSets[lVar16].pArray;
          lVar13 = (long)p->nPatWords[lVar16];
          uVar25 = 0;
          if (lVar13 < 1) {
            bVar26 = false;
          }
          else {
            lVar21 = 0;
            do {
              bVar26 = ((*pawVar17)[lVar21] & ~*(ulong *)((long)pwVar5 + lVar21 * 8 + lVar12)) != 0;
              if (bVar26) break;
              bVar27 = lVar13 + -1 != lVar21;
              lVar21 = lVar21 + 1;
            } while (bVar27);
          }
          if (p->nPatWords[lVar16] < 1) {
            bVar27 = false;
          }
          else {
            lVar21 = 0;
            do {
              bVar27 = (*(ulong *)((long)pwVar5 + lVar21 * 8 + lVar12) & (*pawVar17)[lVar21]) != 0;
              if (bVar27) {
                uVar25 = 1;
                break;
              }
              lVar21 = lVar21 + 1;
            } while (lVar13 != lVar21);
          }
          iVar8 = 0x11;
          if (!(bool)(bVar26 & bVar27)) {
            if (p->iTarget < 0) goto LAB_004b165b;
            *piVar1 = (int)lVar16 + p->iTarget * 2;
            piVar1[1] = uVar25 | (int)uVar23 * 2;
            iVar8 = clock_gettime(3,(timespec *)&ts);
            if (iVar8 < 0) {
              lVar13 = 1;
            }
            else {
              lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            uVar25 = uVar25 | ((int)uVar23 * 4 & 0x3cU) + (int)lVar16 * 2;
            if ((pwVar4[uVar10] >> ((ulong)uVar25 & 0x3f) & 1) == 0) {
              p->nSatCalls = p->nSatCalls + 1;
              iVar8 = sat_solver_solve(p->pSat,pAssump,pAssump + (long)nAssump + 2,lVar11,0,0,0);
            }
            else {
              p->nSatCallsUnsat = p->nSatCallsUnsat + -1;
              iVar8 = -1;
            }
            if (iVar8 == -1) {
              p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar21 = -1;
              }
              else {
                lVar21 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              p->timeSatUnsat = p->timeSatUnsat + lVar21 + lVar13;
              if (piVar1[1] < 0) goto LAB_004b16b8;
              uVar19 = piVar1[1] ^ 1;
              Supp[0][lVar16] = uVar19;
              Vec_IntPush(p->vImpls + lVar16,uVar19);
              puVar2 = pwVar4 + uVar10;
              *puVar2 = *puVar2 | 1L << ((byte)uVar25 & 0x3f);
              iVar8 = 0x11;
            }
            else if (iVar8 == 1) {
              p->nSatCallsSat = p->nSatCallsSat + 1;
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar21 = -1;
              }
              else {
                lVar21 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              iVar8 = 0x11;
              p->timeSatSat = p->timeSatSat + lVar21 + lVar13;
              if (p->nPats[lVar16] == 0x200) {
                p->nSatCallsOver = p->nSatCallsOver + 1;
              }
              else {
                if (0 < p->nDivs) {
                  lVar21 = 0;
                  lVar13 = 0;
                  do {
                    iVar8 = sat_solver_var_value(p->pSat,(int)lVar13);
                    if (iVar8 != 0) {
                      if (p->vSets[lVar16].nSize <= lVar21) goto LAB_004b163c;
                      puVar2 = p->vSets[lVar16].pArray + (p->nPats[lVar16] >> 6) + lVar21;
                      *puVar2 = *puVar2 | 1L << ((byte)p->nPats[lVar16] & 0x3f);
                    }
                    lVar13 = lVar13 + 1;
                    lVar21 = lVar21 + 8;
                  } while (lVar13 < p->nDivs);
                }
                iVar8 = p->nPats[lVar16];
                p->nPatWords[lVar16] = (iVar8 >> 6) + 1;
                p->nPats[lVar16] = iVar8 + 1;
                Masks[lVar16][iVar8 >> 6] = Masks[lVar16][iVar8 >> 6] | 1L << ((byte)iVar8 & 0x3f);
                iVar8 = 0;
              }
            }
            else {
              if (iVar8 != 0) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x393,
                              "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                             );
              }
              p->nTimeOuts = p->nTimeOuts + 1;
              local_22c = 0xfffffffe;
              iVar8 = 1;
            }
          }
          if ((iVar8 != 0x11) && (iVar8 != 0)) {
            bVar26 = false;
            goto LAB_004b0f05;
          }
          pawVar17 = pawVar17 + 1;
          bVar26 = lVar16 == 0;
          lVar16 = lVar16 + 1;
        } while (bVar26);
        bVar26 = true;
        if (Supp[0][1] != -1 && Supp[0][0] != -1) {
          if (Supp[0][0] == Supp[0][1]) {
            iVar8 = p->vImpls[0].nSize;
            if (iVar8 < 1) {
LAB_004b1734:
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x396,"int Vec_IntPop(Vec_Int_t *)");
            }
            p->vImpls[0].nSize = iVar8 + -1;
            iVar8 = p->vImpls[1].nSize;
            if (iVar8 < 1) goto LAB_004b1734;
            p->vImpls[1].nSize = iVar8 + -1;
          }
          else {
            if ((Supp[0][0] < 0) || ((long)Supp[0]._0_8_ < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            if ((uint)Supp[0][0] >> 1 != (uint)Supp[0][1] >> 1) {
              __assert_fail("Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x3aa,
                            "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                           );
            }
            pSVar6 = p->pPars;
            iVar8 = pSVar6->nVarMax;
            uVar10 = 1 << ((char)iVar8 - 6U & 0x1f);
            if (iVar8 < 7) {
              uVar10 = 1;
            }
            if (0 < (int)uVar10) {
              wVar14 = 0x5555555555555555;
              if ((Supp[0]._0_8_ & 1) == 0) {
                wVar14 = 0xaaaaaaaaaaaaaaaa;
              }
              uVar22 = 0;
              do {
                pTruth[uVar22] = wVar14;
                uVar22 = uVar22 + 1;
              } while (uVar10 != uVar22);
            }
            *pSupp = (uint)Supp[0][0] >> 1;
            local_22c = 1;
            if (pSVar6->fVeryVerbose == 0) {
              bVar26 = false;
            }
            else {
              bVar26 = false;
              printf("Found variable %s%d.\n");
            }
          }
        }
LAB_004b0f05:
        if (!bVar26) {
          return local_22c;
        }
        uVar23 = uVar23 + 1;
        lVar12 = lVar12 + 0x40;
      } while ((long)uVar23 < (long)p->nDivs);
    }
    pSVar6 = p->pPars;
    if (pSVar6->nVarMax + -2 < nSuppAdd) {
      if (pSVar6->fVeryVerbose != 0) {
        puts("The number of assumption is more than MFFC size.");
        return -2;
      }
      return -2;
    }
    uVar23 = (ulong)local_22c;
    if (pSVar6->fUseAndOr != 0) {
      uVar22 = 0;
      do {
        uVar24 = uVar22 & 0xffffffff ^ 1;
        if (1 < p->vImpls[uVar24].nSize) {
          p->nSatCalls = p->nSatCalls + 1;
          if (p->iTarget < 0) {
LAB_004b165b:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          *piVar1 = (int)uVar22 + p->iTarget * 2;
          if (0x3dd < p->vImpls[uVar24].nSize) {
            __assert_fail("Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x3c0,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          if (p->vImpls[uVar24].nSize < 1) {
            lVar12 = 0;
          }
          else {
            piVar7 = p->vImpls[uVar24].pArray;
            lVar12 = 0;
            do {
              end[lVar12] = piVar7[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 < p->vImpls[uVar24].nSize);
          }
          iVar8 = clock_gettime(3,(timespec *)&ts);
          if (iVar8 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar8 = sat_solver_solve(p->pSat,pAssump,end + lVar12,lVar11,0,0,0);
          if (iVar8 == -1) {
            piVar7 = (p->pSat->conf_final).ptr;
            uVar10 = (p->pSat->conf_final).size;
            p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
            iVar8 = clock_gettime(3,(timespec *)&ts);
            if (iVar8 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeSatUnsat = p->timeSatUnsat + lVar12 + lVar16;
            if ((int)(uVar10 + nSuppAdd) < 7) {
              if ((int)uVar10 < 1) {
                uVar23 = 0;
              }
              else {
                uVar9 = 0;
                uVar23 = 0;
                do {
                  uVar25 = piVar7[uVar9];
                  if ((int)uVar25 < 0) {
LAB_004b16b8:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                  ,0x10e,"int Abc_LitNot(int)");
                  }
                  lVar12 = (long)p->vImpls[uVar24].nSize;
                  if (0 < lVar12) {
                    uVar25 = uVar25 ^ 1;
                    lVar16 = 0;
                    do {
                      if (p->vImpls[uVar24].pArray[lVar16] == uVar25) {
                        iVar8 = (int)uVar23;
                        uVar23 = (ulong)(iVar8 + 1);
                        pSupp[iVar8] = uVar25;
                        break;
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar12 != lVar16);
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 != uVar10);
              }
              iVar8 = (int)uVar23;
              if (6 < iVar8) {
                __assert_fail("nFinal <= 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x3d7,
                              "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                             );
              }
              if (uVar22 == 0) {
                *pTruth = 0;
                if (0 < iVar8) {
                  lVar12 = 0;
                  puVar15 = (uint *)pSupp;
                  do {
                    uVar25 = *puVar15;
                    if ((int)uVar25 < 0) goto LAB_004b167a;
                    *pTruth = *pTruth | (ulong)(uVar25 & 1) - 1 ^
                                        *(ulong *)((long)s_Truths6 + lVar12);
                    *puVar15 = uVar25 >> 1;
                    lVar12 = lVar12 + 8;
                    puVar15 = puVar15 + 1;
                  } while (uVar23 << 3 != lVar12);
                }
              }
              else {
                *pTruth = 0xffffffffffffffff;
                if (0 < iVar8) {
                  lVar12 = 0;
                  puVar15 = (uint *)pSupp;
                  do {
                    uVar25 = *puVar15;
                    if ((int)uVar25 < 0) goto LAB_004b167a;
                    *pTruth = *pTruth & (-(ulong)(uVar25 & 1) ^ *(ulong *)((long)s_Truths6 + lVar12)
                                        );
                    *puVar15 = uVar25 >> 1;
                    lVar12 = lVar12 + 8;
                    puVar15 = puVar15 + 1;
                  } while (uVar23 << 3 != lVar12);
                }
              }
              pSVar6 = p->pPars;
              iVar3 = pSVar6->nVarMax;
              if (iVar8 != iVar3) {
                if (iVar3 <= iVar8) {
                  __assert_fail("nVarS < nVarB",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                ,0x301,"void Abc_TtStretch6(word *, int, int)");
                }
                uVar25 = 1 << ((char)iVar3 - 6U & 0x1f);
                if (6 < iVar3) {
                  if ((int)uVar25 < 2) {
                    __assert_fail("step < nWords",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                  ,0x306,"void Abc_TtStretch6(word *, int, int)");
                  }
                  uVar24 = 0;
                  do {
                    pTruth[uVar24] = *pTruth;
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
              }
              p->nNodesAndOr = p->nNodesAndOr + 1;
              if (pSVar6->fVeryVerbose != 0) {
                printf("Found %d-input AND/OR gate.\n",uVar23);
              }
            }
            if ((int)(uVar10 + nSuppAdd) < 7) {
              return (int)uVar23;
            }
          }
          else {
            if (iVar8 != 1) {
              if (iVar8 != 0) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x3f0,
                              "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                             );
              }
LAB_004b09d1:
              p->nTimeOuts = p->nTimeOuts + 1;
              return -2;
            }
            p->nSatCallsSat = p->nSatCallsSat + 1;
            iVar8 = clock_gettime(3,(timespec *)&ts);
            if (iVar8 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeSatSat = p->timeSatSat + lVar12 + lVar16;
            if (p->nPats[uVar22] == 0x200) {
              p->nSatCallsOver = p->nSatCallsOver + 1;
            }
            else {
              if (0 < p->nDivs) {
                lVar12 = 0;
                lVar16 = 0;
                do {
                  iVar8 = sat_solver_var_value(p->pSat,(int)lVar16);
                  if (iVar8 != 0) {
                    if (p->vSets[uVar22].nSize <= lVar12) goto LAB_004b163c;
                    puVar2 = p->vSets[uVar22].pArray + (p->nPats[uVar22] >> 6) + lVar12;
                    *puVar2 = *puVar2 | 1L << ((byte)p->nPats[uVar22] & 0x3f);
                  }
                  lVar16 = lVar16 + 1;
                  lVar12 = lVar12 + 8;
                } while (lVar16 < p->nDivs);
              }
              iVar8 = p->nPats[uVar22];
              p->nPatWords[uVar22] = (iVar8 >> 6) + 1;
              p->nPats[uVar22] = iVar8 + 1;
              Masks[uVar22][iVar8 >> 6] = Masks[uVar22][iVar8 >> 6] | 1L << ((byte)iVar8 & 0x3f);
            }
          }
        }
        bVar26 = uVar22 == 0;
        uVar22 = uVar22 + 1;
      } while (bVar26);
    }
    uVar10 = Sfm_DecFindBestVar(p,Masks);
    if (fCofactor != 0 && uVar10 == 0xffffffff) {
      lVar11 = (long)(p->vObjInMffc).nSize;
      if (lVar11 < 1) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar25 = (p->vObjDec).nSize;
        do {
          uVar10 = (p->vObjInMffc).pArray[lVar11 + -1];
          if ((int)uVar25 < 1) goto LAB_004b15bf;
          lVar12 = 0;
          do {
            uVar19 = (p->vObjDec).pArray[lVar12];
            if (uVar19 == uVar10) break;
            bVar26 = (ulong)uVar25 - 1 != lVar12;
            lVar12 = lVar12 + 1;
          } while (bVar26);
          if (uVar19 != uVar10) goto LAB_004b15bf;
          bVar26 = 1 < lVar11;
          lVar11 = lVar11 + -1;
        } while (bVar26);
        lVar11 = 0;
      }
LAB_004b15bf:
      fCofactor = 0;
      uVar10 = -(uint)((int)lVar11 == 0) | uVar10;
    }
    if (p->pPars->fVeryVerbose != 0) {
      Sfm_DecPrint(p,Masks);
      printf("Best var %d\n",(ulong)uVar10);
      putchar(10);
    }
  }
  else {
    p->iUseThis = -1;
  }
  if ((int)uVar10 < 0) {
    return -2;
  }
  nSupp[0] = 0;
  nSupp[1] = 0;
  Vec_IntPush(&p->vObjDec,uVar10);
  uVar25 = uVar10 * 8;
  lVar11 = 0;
  do {
    ptVar18 = &ts;
    pawVar17 = Masks;
    lVar12 = 0;
    do {
      uVar19 = p->vSets[lVar12].nSize;
      if (uVar19 == uVar25 || SBORROW4(uVar19,uVar25) != (int)(uVar19 + uVar10 * -8) < 0) {
LAB_004b163c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pwVar4 = p->vSets[lVar12].pArray;
      uVar19 = p->nPatWords[lVar12];
      if (lVar11 == 0) {
        if (0 < (int)uVar19) {
          uVar23 = 0;
          do {
            (&ptVar18->tv_sec)[uVar23] = ~pwVar4[uVar25 + uVar23] & (*pawVar17)[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar19 != uVar23);
        }
      }
      else if (0 < (int)uVar19) {
        uVar23 = 0;
        do {
          (&ptVar18->tv_sec)[uVar23] = pwVar4[uVar25 + uVar23] & (*pawVar17)[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      if ((int)uVar19 < 8) {
        memset(&(&ts)[lVar12 * 4].tv_sec + (int)uVar19,0,(ulong)(7 - uVar19) * 8 + 8);
      }
      ptVar18 = ptVar18 + 4;
      pawVar17 = pawVar17 + 1;
      bVar26 = lVar12 == 0;
      lVar12 = lVar12 + 1;
    } while (bVar26);
    pAssump[nAssump] = (uVar10 * 2 | (uint)lVar11) ^ 1;
    memcpy(p->pDivWords[nAssump + 1],p->pDivWords[nAssump],(long)p->nDivWords << 3);
    iVar8 = 0;
    if (lVar11 != 0) {
      iVar8 = nSupp[0];
    }
    iVar8 = Sfm_DecPeformDec_rec
                      (p,uTruth[lVar11],Supp[lVar11],pAssump,nAssump + 1,(word (*) [8])&ts,fCofactor
                       ,iVar8 + nSuppAdd + 1);
    nSupp[lVar11] = iVar8;
    if (iVar8 == -2) {
      return -2;
    }
    bVar26 = lVar11 != 0;
    lVar11 = lVar11 + 1;
    if (bVar26) {
      iVar8 = Sfm_DecCombineDec(p,uTruth[0],uTruth[1],Supp[0],Supp[1],nSupp[0],nSupp[1],pTruth,pSupp
                                ,uVar10);
      return iVar8;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec_rec( Sfm_Dec_t * p, word * pTruth, int * pSupp, int * pAssump, int nAssump, word Masks[2][SFM_SIM_WORDS], int fCofactor, int nSuppAdd )
{
    int nBTLimit = p->pPars->nBTLimit;
//    int fVerbose = p->pPars->fVeryVerbose;
    int c, i, d, iLit, status, Var = -1;
    word * pDivWords = p->pDivWords[nAssump];
    abctime clk;
    assert( nAssump <= SFM_SUPP_MAX );
    if ( p->pPars->fVeryVerbose )
    {
        printf( "\nObject %d\n", p->iTarget );
        printf( "Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ", p->nDivs, Vec_IntSize(&p->vObjGates), p->nMffc, MIO_NUMINV*p->AreaMffc );
        printf( "Pat0 = %d.  Pat1 = %d.    ", p->nPats[0], p->nPats[1] );
        printf( "\n" );
        if ( nAssump )
        {
            printf( "Cofactor: " );
            for ( i = 0; i < nAssump; i++ )
                printf( " %s%d", Abc_LitIsCompl(pAssump[i])? "!":"", Abc_Lit2Var(pAssump[i]) );
            printf( "\n" );
        }
    }
    // check constant
    for ( c = 0; c < 2; c++ )
    {
        if ( !Abc_TtIsConst0(Masks[c], p->nPatWords[c]) ) // there are some patterns
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            Abc_TtConst( pTruth, Abc_TtWordNum(p->pPars->nVarMax), c );
            if ( p->pPars->fVeryVerbose )
                printf( "Found constant %d.\n", c );
            return 0;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    if ( p->iUseThis != -1 )
    {
        Var = p->iUseThis;
        p->iUseThis = -1;
        goto cofactor;
    }

    // check implications
    Vec_IntClear( &p->vImpls[0] );
    Vec_IntClear( &p->vImpls[1] );
    for ( d = 0; d < p->nDivs; d++ )
    {
        int Impls[2] = {-1, -1};
        for ( c = 0; c < 2; c++ )
        {
            word * pPats = Sfm_DecDivPats( p, d, c );
            int fHas0s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 1 );
            int fHas1s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 0 );
            if ( fHas0s && fHas1s )
                continue;
            pAssump[nAssump]   = Abc_Var2Lit( p->iTarget, c );
            pAssump[nAssump+1] = Abc_Var2Lit( d, fHas1s ); // if there are 1s, check if 0 is SAT
            clk = Abc_Clock();
            if ( Abc_TtGetBit( pDivWords, 4*d+2*c+fHas1s ) )
            {
                p->nSatCallsUnsat--;
                status = l_False;
            }
            else
            {
                p->nSatCalls++;
                status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 2, nBTLimit, 0, 0, 0 );
            }
            if ( status == l_Undef )
            {
                p->nTimeOuts++;
                return -2;
            }
            if ( status == l_False )
            {
                p->nSatCallsUnsat++;
                p->timeSatUnsat += Abc_Clock() - clk;
                Impls[c] = Abc_LitNot(pAssump[nAssump+1]);
                Vec_IntPush( &p->vImpls[c], Abc_LitNot(pAssump[nAssump+1]) );
                Abc_TtSetBit( pDivWords, 4*d+2*c+fHas1s );
                continue;
            }
            assert( status == l_True );
            p->nSatCallsSat++;
            p->timeSatSat += Abc_Clock() - clk;
            if ( p->nPats[c] == 64*SFM_SIM_WORDS )
            {
                p->nSatCallsOver++;
                continue;//return -2;//continue;
            }
            // record this status
            for ( i = 0; i < p->nDivs; i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                    Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
            Abc_TtSetBit( Masks[c], p->nPats[c]++ );
        }
        if ( Impls[0] == -1 || Impls[1] == -1 )
            continue;
        if ( Impls[0] == Impls[1] )
        {
            Vec_IntPop( &p->vImpls[0] );
            Vec_IntPop( &p->vImpls[1] );
            continue;
        }
        assert( Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1]) );
        // found buffer/inverter
        Abc_TtUnit( pTruth, Abc_TtWordNum(p->pPars->nVarMax), Abc_LitIsCompl(Impls[0]) );
        pSupp[0] = Abc_Lit2Var(Impls[0]);
        if ( p->pPars->fVeryVerbose )
            printf( "Found variable %s%d.\n", Abc_LitIsCompl(Impls[0]) ? "!":"", pSupp[0] );
        return 1;        
    }
    if ( nSuppAdd > p->pPars->nVarMax - 2 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "The number of assumption is more than MFFC size.\n" );
        return -2;
    }
    // try using all implications at once
    if ( p->pPars->fUseAndOr )
    for ( c = 0; c < 2; c++ )
    {
        if ( Vec_IntSize(&p->vImpls[!c]) < 2 )
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        assert( Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10 );
        Vec_IntForEachEntry( &p->vImpls[!c], iLit, i )
            pAssump[nAssump+1+i] = iLit;
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump+1+i, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            int * pFinal, nFinal = sat_solver_final( p->pSat, &pFinal );
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            if ( nFinal + nSuppAdd > 6 )
                continue;
            // collect only relevant literals
            for ( i = d = 0; i < nFinal; i++ )
                if ( Vec_IntFind(&p->vImpls[!c], Abc_LitNot(pFinal[i])) >= 0 )
                    pSupp[d++] = Abc_LitNot(pFinal[i]);
            nFinal = d;
            // create AND/OR gate
            assert( nFinal <= 6 );
            if ( c )
            {
                *pTruth = ~(word)0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth &= Abc_LitIsCompl(pSupp[i]) ? ~s_Truths6[i] : s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            else
            {
                *pTruth = 0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth |= Abc_LitIsCompl(pSupp[i]) ? s_Truths6[i] : ~s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            Abc_TtStretch6( pTruth, nFinal, p->pPars->nVarMax );
            p->nNodesAndOr++;
            if ( p->pPars->fVeryVerbose )
                printf( "Found %d-input AND/OR gate.\n", nFinal );
            return nFinal;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    // find the best cofactoring variable
//    if ( !fCofactor || Vec_IntSize(&p->vImpls[0]) + Vec_IntSize(&p->vImpls[1]) > 2 )
    Var = Sfm_DecFindBestVar( p, Masks );
//    if ( Var == -1 )
//        Var = Sfm_DecFindBestVar2( p, Masks );

/*
    {
        int Lit0 = Vec_IntSize(&p->vImpls[0]) ? Vec_IntEntry(&p->vImpls[0], 0) : -1;
        int Lit1 = Vec_IntSize(&p->vImpls[1]) ? Vec_IntEntry(&p->vImpls[1], 0) : -1;
        if ( Lit0 == -1 && Lit1 >= 0 )
            Var = Abc_Lit2Var(Lit1);
        else if ( Lit1 == -1 && Lit0 >= 0 )
            Var = Abc_Lit2Var(Lit0);
        else if ( Lit0 >= 0 && Lit1 >= 0 )
        {
            if ( Lit0 < Lit1 )
                Var = Abc_Lit2Var(Lit0);
            else
                Var = Abc_Lit2Var(Lit1);
        }
    }
*/

    if ( Var == -1 && fCofactor )
    {
        //for ( Var = p->nDivs - 1; Var >= 0; Var-- )
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
            if ( Vec_IntFind(&p->vObjDec, Var) == -1 )
                break;
//        if ( i == Vec_IntSize(&p->vObjInMffc) )
        if ( i == -1 )
            Var = -1;
        fCofactor = 0;
    }

    if ( p->pPars->fVeryVerbose )
    {
        Sfm_DecPrint( p, Masks );
        printf( "Best var %d\n", Var );
        printf( "\n" );
    }
cofactor:
    // cofactor the problem
    if ( Var >= 0 )
    {
        word uTruth[2][SFM_WORD_MAX], MasksNext[2][SFM_SIM_WORDS];
        int w, Supp[2][2*SFM_SUPP_MAX], nSupp[2] = {0};
        Vec_IntPush( &p->vObjDec, Var );
        for ( i = 0; i < 2; i++ )
        {
            for ( c = 0; c < 2; c++ )
            {
                Abc_TtAndSharp( MasksNext[c], Masks[c], Sfm_DecDivPats(p, Var, c), p->nPatWords[c], !i );
                for ( w = p->nPatWords[c]; w < SFM_SIM_WORDS; w++ )
                    MasksNext[c][w] = 0;
            }
            pAssump[nAssump] = Abc_Var2Lit( Var, !i );
            memcpy( p->pDivWords[nAssump+1], p->pDivWords[nAssump], sizeof(word) * p->nDivWords );
            nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], Supp[i], pAssump, nAssump+1, MasksNext, fCofactor, (i ? nSupp[0] : 0) + nSuppAdd + 1 );
            if ( nSupp[i] == -2 )
                return -2;
        }
        // combine solutions
        return Sfm_DecCombineDec( p, uTruth[0], uTruth[1], Supp[0], Supp[1], nSupp[0], nSupp[1], pTruth, pSupp, Var );
    }
    return -2;
}